

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can.c
# Opt level: O1

int csp_can2_rx(csp_iface_t *iface,uint32_t id,uint8_t *data,uint8_t dlc,int *task_woken)

{
  csp_can_interface_data_t *ifdata;
  ushort uVar1;
  csp_packet_t *packet;
  
  ifdata = (csp_can_interface_data_t *)iface->interface_data;
  packet = csp_can_pbuf_find(ifdata,id,0x1fffffe0,task_woken);
  if (packet == (csp_packet_t *)0x0) {
    if ((id & 2) == 0) {
      iface->frame = iface->frame + 1;
      return -2;
    }
    packet = csp_can_pbuf_new(ifdata,id,task_woken);
  }
  if ((id & 2) == 0) {
    if ((id >> 2 & 7) != (uint)packet->rx_count) {
      csp_dbg_can_errno = '\x01';
      csp_can_pbuf_free(ifdata,packet,1,task_woken);
      iface->frame = iface->frame + 1;
      return -2;
    }
    packet->rx_count = packet->rx_count + 1 & 7;
  }
  else {
    if (dlc < 4) {
      csp_dbg_can_errno = '\x04';
      iface->frame = iface->frame + 1;
      goto LAB_0010db5d;
    }
    csp_id_setup_rx(packet);
    uVar1 = (ushort)(id >> 0xd);
    *(ushort *)packet->frame_begin = uVar1 << 8 | uVar1 >> 8;
    *(undefined4 *)(packet->frame_begin + 2) = *(undefined4 *)data;
    packet->frame_length = 6;
    packet->length = 0;
    data = data + 4;
    dlc = dlc - 4;
    packet->rx_count = 1;
  }
  if ((csp_packet_t *)(packet->frame_begin + packet->frame_length + dlc) <= packet + 1) {
    memcpy(packet->frame_begin + packet->frame_length,data,(ulong)dlc);
    packet->frame_length = packet->frame_length + (ushort)dlc;
    if ((id & 1) == 0) {
      return 0;
    }
    csp_id_strip(packet);
    if ((packet->id).dst == 0x3fff) {
      (packet->id).dst = iface->addr;
    }
    csp_can_pbuf_free(ifdata,packet,0,task_woken);
    csp_qfifo_write(packet,iface,task_woken);
    return 0;
  }
  csp_dbg_can_errno = '\x02';
  iface->rx_error = iface->rx_error + 1;
LAB_0010db5d:
  csp_can_pbuf_free(ifdata,packet,1,task_woken);
  return -2;
}

Assistant:

int csp_can2_rx(csp_iface_t * iface, uint32_t id, const uint8_t * data, uint8_t dlc, int * task_woken) {

	csp_can_interface_data_t * ifdata = iface->interface_data;

	/* Bind incoming frame to a packet buffer */
	csp_packet_t * packet = csp_can_pbuf_find(ifdata, id, CFP2_ID_CONN_MASK, task_woken);
	if (packet == NULL) {
		if (id & (CFP2_BEGIN_MASK << CFP2_BEGIN_OFFSET)) {
			packet = csp_can_pbuf_new(ifdata, id, task_woken);
		} else {
			iface->frame++;
			return CSP_ERR_INVAL;
		}
	}


	/* BEGIN */
	if (id & (CFP2_BEGIN_MASK << CFP2_BEGIN_OFFSET)) {

		/* Discard packet if DLC is less than CSP id + CSP length fields */
		if (dlc < 4) {
			csp_dbg_can_errno = CSP_DBG_CAN_ERR_SHORT_BEGIN;
			iface->frame++;
			csp_can_pbuf_free(ifdata, packet, 1, task_woken);
			return CSP_ERR_INVAL;
		}

		csp_id_setup_rx(packet);

		/* Copy first 2 bytes from CFP 2.0 header:
		 * Because the id field has already been converted in memory to a 32-bit
		 * host-order field, extract the first two bytes and convert back to
		 * network order */
		uint16_t first_two = id >> CFP2_DST_OFFSET;
		first_two = htobe16(first_two);
		memcpy(packet->frame_begin, &first_two, 2);

		/* Copy next 4 from data, the data field is in network order */
		memcpy(&packet->frame_begin[2], data, 4);

		packet->frame_length = 6;
		packet->length = 0;

		/* Move RX offset for incoming data */
		data += 4;
		dlc -= 4;

		/* Set next expected fragment counter to be 1 */
		packet->rx_count = 1;

		/* FRAGMENT */
	} else {

		int fragment_counter = (id >> CFP2_FC_OFFSET) & CFP2_FC_MASK;

		/* Check fragment counter is increasing:
		 * We abuse / reuse the rx_count pbuf field
		 * (Note this could be done using csp buffers instead) */
		if ((packet->rx_count) != fragment_counter) {
			csp_dbg_can_errno = CSP_DBG_CAN_ERR_FRAME_LOST;
			csp_can_pbuf_free(ifdata, packet, 1, task_woken);
			iface->frame++;
			return CSP_ERR_INVAL;
		}

		/* Increment expected next fragment counter:
		 * and with the mask in order to wrap around */
		packet->rx_count = (packet->rx_count + 1) & CFP2_FC_MASK;
	}

	/* Check for overflow. The frame input + dlc must not exceed the end of the packet data field */
	if (&packet->frame_begin[packet->frame_length] + dlc > &packet->data[sizeof(packet->data)]) {
		csp_dbg_can_errno = CSP_DBG_CAN_ERR_RX_OVF;
		iface->rx_error++;
		csp_can_pbuf_free(ifdata, packet, 1, task_woken);
		return CSP_ERR_INVAL;
	}

	/* Copy dlc bytes into buffer */
	memcpy(&packet->frame_begin[packet->frame_length], data, dlc);
	packet->frame_length += dlc;

	/* END */
	if (id & (CFP2_END_MASK << CFP2_END_OFFSET)) {

		/* Parse CSP header into csp_id type */
		csp_id_strip(packet);

		/* Rewrite incoming L2 broadcast to local node */
		if (packet->id.dst == 0x3FFF) {
			packet->id.dst = iface->addr;
		}

		/* Free packet buffer */
		csp_can_pbuf_free(ifdata, packet, 0, task_woken);

		/* Data is available */
		csp_qfifo_write(packet, iface, task_woken);

	}

	return CSP_ERR_NONE;
}